

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.c
# Opt level: O3

void prf_state_matrix_mult_right(prf_state_t *state,matrix4x4_f32_t *m)

{
  float32_t *pfVar1;
  matrix4x4_f32_t *paafVar2;
  undefined8 *puVar3;
  long lVar4;
  long lVar5;
  float32_t *pfVar6;
  long lVar7;
  float fVar8;
  undefined8 uStack_48;
  matrix4x4_f32_t copy;
  
  paafVar2 = state->matrix[state->state_push_level];
  puVar3 = &uStack_48;
  copy[2]._8_8_ = *(undefined8 *)(*paafVar2)[3];
  copy[3]._0_8_ = *(undefined8 *)((*paafVar2)[3] + 2);
  copy[1]._8_8_ = *(undefined8 *)(*paafVar2)[2];
  copy[2]._0_8_ = *(undefined8 *)((*paafVar2)[2] + 2);
  copy[0]._8_8_ = *(undefined8 *)(*paafVar2)[1];
  copy[1]._0_8_ = *(undefined8 *)((*paafVar2)[1] + 2);
  uStack_48 = *(undefined8 *)(*paafVar2)[0];
  copy[0]._0_8_ = *(undefined8 *)((*paafVar2)[0] + 2);
  lVar4 = 0;
  do {
    lVar7 = 0;
    pfVar6 = (float32_t *)m;
    do {
      pfVar1 = (*paafVar2)[lVar4] + lVar7;
      *pfVar1 = 0.0;
      fVar8 = 0.0;
      lVar5 = 0;
      do {
        fVar8 = fVar8 + *(float *)((long)puVar3 + lVar5) * (float)pfVar6[lVar5];
        *pfVar1 = (float32_t)fVar8;
        lVar5 = lVar5 + 4;
      } while (lVar5 != 0x10);
      lVar7 = lVar7 + 1;
      pfVar6 = pfVar6 + 1;
    } while (lVar7 != 4);
    lVar4 = lVar4 + 1;
    puVar3 = puVar3 + 2;
  } while (lVar4 != 4);
  state->inv_dirty = 1;
  return;
}

Assistant:

void
prf_state_matrix_mult_right(
    prf_state_t * state,
    matrix4x4_f32_t * m )
{
    matrix4x4_f32_t copy;
    matrix4x4_f32_t * matrix;
    int i, j, n;

    assert( state != NULL && m != NULL );

    matrix = state->matrix[ state->state_push_level ];
    memcpy( &copy, matrix, sizeof( matrix4x4_f32_t ) );

    /* right-multiplication of matrix */
    for ( i = 0; i < 4; i++ ) {
        for ( j = 0; j < 4; j++ ) {
            (*matrix)[i][j] = 0.0f;
            for ( n = 0; n < 4; n++ )
                (*matrix)[i][j] += copy[i][n] * (*m)[n][j];
        }
    }
    state->inv_dirty = TRUE;

}